

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_delmaster(Pager *pPager,char *zMaster)

{
  int iVar1;
  bool bVar2;
  int flags_1;
  int c;
  int exists;
  int flags;
  int nMasterPtr;
  char *zMasterPtr;
  char *zJournal;
  i64 nMasterJournal;
  char *zMasterJournal;
  sqlite3_file *pJournal;
  sqlite3_file *pMaster;
  sqlite3_vfs *psStack_20;
  int rc;
  sqlite3_vfs *pVfs;
  char *zMaster_local;
  Pager *pPager_local;
  
  psStack_20 = pPager->pVfs;
  nMasterJournal = 0;
  pVfs = (sqlite3_vfs *)zMaster;
  zMaster_local = (char *)pPager;
  pJournal = (sqlite3_file *)sqlite3MallocZero((long)(psStack_20->szOsFile << 1));
  zMasterJournal = (char *)((long)&pJournal->pMethods + (long)psStack_20->szOsFile);
  if (pJournal == (sqlite3_file *)0x0) {
    pMaster._4_4_ = 7;
  }
  else {
    c = 0x4001;
    pMaster._4_4_ = sqlite3OsOpen(psStack_20,(char *)pVfs,pJournal,0x4001,(int *)0x0);
  }
  if ((pMaster._4_4_ == 0) &&
     (pMaster._4_4_ = sqlite3OsFileSize(pJournal,(i64 *)&zJournal), pMaster._4_4_ == 0)) {
    exists = psStack_20->mxPathname + 1;
    nMasterJournal = (i64)sqlite3Malloc((u64)(zJournal + (long)exists + 1));
    if ((void *)nMasterJournal == (void *)0x0) {
      pMaster._4_4_ = 7;
    }
    else {
      _flags = (char *)(nMasterJournal + (long)(zJournal + 1));
      pMaster._4_4_ = sqlite3OsRead(pJournal,(void *)nMasterJournal,(int)zJournal,0);
      if (pMaster._4_4_ == 0) {
        zJournal[nMasterJournal] = '\0';
        pMaster._4_4_ = 0;
        for (zMasterPtr = (char *)nMasterJournal; (long)zMasterPtr - nMasterJournal < (long)zJournal
            ; zMasterPtr = zMasterPtr + (iVar1 + 1)) {
          pMaster._4_4_ = sqlite3OsAccess(psStack_20,zMasterPtr,0,&flags_1);
          if (pMaster._4_4_ != 0) goto LAB_00166ac4;
          iVar1 = 0;
          if (flags_1 != 0) {
            pMaster._4_4_ =
                 sqlite3OsOpen(psStack_20,zMasterPtr,(sqlite3_file *)zMasterJournal,0x801,(int *)0x0
                              );
            if (pMaster._4_4_ != 0) goto LAB_00166ac4;
            pMaster._4_4_ = readMasterJournal((sqlite3_file *)zMasterJournal,_flags,exists);
            sqlite3OsClose((sqlite3_file *)zMasterJournal);
            if (pMaster._4_4_ != 0) goto LAB_00166ac4;
            bVar2 = false;
            if (*_flags != '\0') {
              iVar1 = strcmp(_flags,(char *)pVfs);
              bVar2 = iVar1 == 0;
            }
            iVar1 = pMaster._4_4_;
            if (bVar2) goto LAB_00166ac4;
          }
          pMaster._4_4_ = iVar1;
          iVar1 = sqlite3Strlen30(zMasterPtr);
        }
        sqlite3OsClose(pJournal);
        pMaster._4_4_ = sqlite3OsDelete(psStack_20,(char *)pVfs,0);
      }
    }
  }
LAB_00166ac4:
  sqlite3_free((void *)nMasterJournal);
  if (pJournal != (sqlite3_file *)0x0) {
    sqlite3OsClose(pJournal);
    sqlite3_free(pJournal);
  }
  return pMaster._4_4_;
}

Assistant:

static int pager_delmaster(Pager *pPager, const char *zMaster){
  sqlite3_vfs *pVfs = pPager->pVfs;
  int rc;                   /* Return code */
  sqlite3_file *pMaster;    /* Malloc'd master-journal file descriptor */
  sqlite3_file *pJournal;   /* Malloc'd child-journal file descriptor */
  char *zMasterJournal = 0; /* Contents of master journal file */
  i64 nMasterJournal;       /* Size of master journal file */
  char *zJournal;           /* Pointer to one journal within MJ file */
  char *zMasterPtr;         /* Space to hold MJ filename from a journal file */
  int nMasterPtr;           /* Amount of space allocated to zMasterPtr[] */

  /* Allocate space for both the pJournal and pMaster file descriptors.
  ** If successful, open the master journal file for reading.
  */
  pMaster = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile * 2);
  pJournal = (sqlite3_file *)(((u8 *)pMaster) + pVfs->szOsFile);
  if( !pMaster ){
    rc = SQLITE_NOMEM_BKPT;
  }else{
    const int flags = (SQLITE_OPEN_READONLY|SQLITE_OPEN_MASTER_JOURNAL);
    rc = sqlite3OsOpen(pVfs, zMaster, pMaster, flags, 0);
  }
  if( rc!=SQLITE_OK ) goto delmaster_out;

  /* Load the entire master journal file into space obtained from
  ** sqlite3_malloc() and pointed to by zMasterJournal.   Also obtain
  ** sufficient space (in zMasterPtr) to hold the names of master
  ** journal files extracted from regular rollback-journals.
  */
  rc = sqlite3OsFileSize(pMaster, &nMasterJournal);
  if( rc!=SQLITE_OK ) goto delmaster_out;
  nMasterPtr = pVfs->mxPathname+1;
  zMasterJournal = sqlite3Malloc(nMasterJournal + nMasterPtr + 1);
  if( !zMasterJournal ){
    rc = SQLITE_NOMEM_BKPT;
    goto delmaster_out;
  }
  zMasterPtr = &zMasterJournal[nMasterJournal+1];
  rc = sqlite3OsRead(pMaster, zMasterJournal, (int)nMasterJournal, 0);
  if( rc!=SQLITE_OK ) goto delmaster_out;
  zMasterJournal[nMasterJournal] = 0;

  zJournal = zMasterJournal;
  while( (zJournal-zMasterJournal)<nMasterJournal ){
    int exists;
    rc = sqlite3OsAccess(pVfs, zJournal, SQLITE_ACCESS_EXISTS, &exists);
    if( rc!=SQLITE_OK ){
      goto delmaster_out;
    }
    if( exists ){
      /* One of the journals pointed to by the master journal exists.
      ** Open it and check if it points at the master journal. If
      ** so, return without deleting the master journal file.
      */
      int c;
      int flags = (SQLITE_OPEN_READONLY|SQLITE_OPEN_MAIN_JOURNAL);
      rc = sqlite3OsOpen(pVfs, zJournal, pJournal, flags, 0);
      if( rc!=SQLITE_OK ){
        goto delmaster_out;
      }

      rc = readMasterJournal(pJournal, zMasterPtr, nMasterPtr);
      sqlite3OsClose(pJournal);
      if( rc!=SQLITE_OK ){
        goto delmaster_out;
      }

      c = zMasterPtr[0]!=0 && strcmp(zMasterPtr, zMaster)==0;
      if( c ){
        /* We have a match. Do not delete the master journal file. */
        goto delmaster_out;
      }
    }
    zJournal += (sqlite3Strlen30(zJournal)+1);
  }
 
  sqlite3OsClose(pMaster);
  rc = sqlite3OsDelete(pVfs, zMaster, 0);

delmaster_out:
  sqlite3_free(zMasterJournal);
  if( pMaster ){
    sqlite3OsClose(pMaster);
    assert( !isOpen(pJournal) );
    sqlite3_free(pMaster);
  }
  return rc;
}